

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseQuotedText(WastParser *this,string *text)

{
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  byte bVar2;
  bool bVar3;
  TokenType TVar4;
  Result RVar5;
  char *pcVar6;
  char *pcVar8;
  uint32_t hi;
  Token token;
  uint32_t local_90;
  uint32_t local_8c;
  anon_union_24_4_98baf137_for_Token_2 local_88;
  Token local_70;
  char *pcVar7;
  
  TVar4 = Peek(this,0);
  if (TVar4 == Text) {
    Consume(&local_70,this);
    if (5 < local_70.token_type_ - AlignEqNat) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/token.h"
                    ,0x5b,"string_view wabt::Token::text() const");
    }
    local_88.text_.size_ = local_70.field_2.text_.size_;
    local_88.text_.data_ = local_70.field_2.text_.data_;
    if (2 < local_70.field_2.text_.size_) {
      local_88.text_ = string_view::substr(&local_88.text_,1,local_70.field_2.text_.size_ - 2);
      pcVar6 = local_88.text_.data_;
      if (0 < (long)local_88.text_.size_) {
        pcVar8 = pcVar6 + local_88.text_.size_;
        do {
          pcVar7 = pcVar6;
          if (*pcVar6 == '\\') {
            pcVar7 = pcVar6 + 1;
            bVar2 = pcVar6[1];
            if (bVar2 < 0x6e) {
              if (((bVar2 != 0x22) && (bVar2 != 0x27)) && (bVar2 != 0x5c)) {
LAB_0016e627:
                RVar5 = ParseHexdigit(*pcVar7,&local_8c);
                if ((RVar5.enum_ != Ok) ||
                   (RVar5 = ParseHexdigit(pcVar6[2],&local_90), RVar5.enum_ != Ok)) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                                ,0x58,
                                "void wabt::(anonymous namespace)::RemoveEscapes(string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::basic_string<char>>]"
                               );
                }
                pcVar7 = pcVar6 + 2;
                goto LAB_0016e5ea;
              }
            }
            else if (((bVar2 != 0x74) && (bVar2 != 0x72)) && (bVar2 != 0x6e)) goto LAB_0016e627;
            std::__cxx11::string::push_back((char)text);
          }
          else {
LAB_0016e5ea:
            std::__cxx11::string::push_back((char)text);
          }
          pcVar6 = pcVar7 + 1;
        } while (pcVar6 < pcVar8);
      }
    }
    bVar3 = IsValidUtf8((text->_M_dataplus)._M_p,text->_M_string_length);
    if (!bVar3) {
      Error(this,0x1b1cad);
    }
    RVar5.enum_ = Ok;
  }
  else {
    paVar1 = &local_70.loc.field_1;
    local_70.loc.filename.data_ = (char *)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"a quoted string","");
    local_88.text_ = (string_view)ZEXT816(0);
    local_88.literal_.text.size_ = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
               &local_70,&local_70.token_type_);
    RVar5 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_88.text_,"\"foo\"");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88.text_);
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_70.loc.filename.data_ != paVar1) {
      operator_delete(local_70.loc.filename.data_);
    }
  }
  return (Result)RVar5.enum_;
}

Assistant:

Result WastParser::ParseQuotedText(std::string* text) {
  WABT_TRACE(ParseQuotedText);
  if (!PeekMatch(TokenType::Text)) {
    return ErrorExpected({"a quoted string"}, "\"foo\"");
  }

  Token token = Consume();
  RemoveEscapes(token.text(), std::back_inserter(*text));
  if (!IsValidUtf8(text->data(), text->length())) {
    Error(token.loc, "quoted string has an invalid utf-8 encoding");
  }
  return Result::Ok;
}